

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O2

int ARKStepSetDefaults(void *arkode_mem)

{
  int iVar1;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"ARKStepSetDefaults",&ark_mem,&step_mem);
  if (iVar1 == 0) {
    iVar1 = arkSetDefaults(ark_mem);
    if (iVar1 == 0) {
      step_mem->q = 4;
      step_mem->p = 0;
      step_mem->predictor = 0;
      step_mem->linear = 0;
      step_mem->linear_timedep = 1;
      step_mem->explicit = 1;
      step_mem->implicit = 1;
      step_mem->deduce_rhs = 0;
      step_mem->maxcor = 3;
      step_mem->nlscoef = 0.1;
      step_mem->crdown = 0.3;
      step_mem->rdiv = 2.3;
      step_mem->dgmax = 0.2;
      step_mem->msbp = 0x14;
      step_mem->convfail = 0;
      step_mem->jcur = 0;
      step_mem->istage = 0;
      step_mem->stages = 0;
      step_mem->Be = (ARKodeButcherTable)0x0;
      step_mem->Bi = (ARKodeButcherTable)0x0;
      step_mem->stage_predict = (ARKStagePredictFn)0x0;
      step_mem->NLS = (SUNNonlinearSolver)0x0;
      iVar1 = 0;
    }
    else {
      arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::ARKStep","ARKStepSetDefaults",
                      "Error setting ARKode infrastructure defaults");
    }
  }
  return iVar1;
}

Assistant:

int ARKStepSetDefaults(void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepSetDefaults",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* Set default ARKode infrastructure parameters */
  retval = arkSetDefaults(ark_mem);
  if (retval != ARK_SUCCESS) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::ARKStep",
                    "ARKStepSetDefaults",
                    "Error setting ARKode infrastructure defaults");
    return(retval);
  }

  /* Set default values for integrator optional inputs */
  step_mem->q                = Q_DEFAULT;      /* method order */
  step_mem->p                = 0;              /* embedding order */
  step_mem->predictor        = 0;              /* trivial predictor */
  step_mem->linear           = SUNFALSE;       /* nonlinear problem */
  step_mem->linear_timedep   = SUNTRUE;        /* dfi/dy depends on t */
  step_mem->explicit         = SUNTRUE;        /* fe(t,y) will be used */
  step_mem->implicit         = SUNTRUE;        /* fi(t,y) will be used */
  step_mem->deduce_rhs       = SUNFALSE;       /* deduce fi on result of NLS */
  step_mem->maxcor           = MAXCOR;         /* max nonlinear iters/stage */
  step_mem->nlscoef          = NLSCOEF;        /* nonlinear tolerance coefficient */
  step_mem->crdown           = CRDOWN;         /* nonlinear convergence estimate coeff. */
  step_mem->rdiv             = RDIV;           /* nonlinear divergence tolerance */
  step_mem->dgmax            = DGMAX;          /* max step change before recomputing J or P */
  step_mem->msbp             = MSBP;           /* max steps between updates to J or P */
  step_mem->stages           = 0;              /* no stages */
  step_mem->istage           = 0;              /* current stage */
  step_mem->Be               = NULL;           /* no Butcher tables */
  step_mem->Bi               = NULL;
  step_mem->NLS              = NULL;           /* no nonlinear solver object */
  step_mem->jcur             = SUNFALSE;
  step_mem->convfail         = ARK_NO_FAILURES;
  step_mem->stage_predict    = NULL;           /* no user-supplied stage predictor */
  return(ARK_SUCCESS);
}